

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

void secp256k1_schnorrsig_challenge
               (secp256k1_scalar *e,uchar *r32,uchar *msg,size_t msglen,uchar *pubkey32)

{
  undefined1 local_c0 [8];
  secp256k1_sha256 sha;
  uchar buf [32];
  uchar *pubkey32_local;
  size_t msglen_local;
  uchar *msg_local;
  uchar *r32_local;
  secp256k1_scalar *e_local;
  
  secp256k1_schnorrsig_sha256_tagged((secp256k1_sha256 *)local_c0);
  secp256k1_sha256_write((secp256k1_sha256 *)local_c0,r32,0x20);
  secp256k1_sha256_write((secp256k1_sha256 *)local_c0,pubkey32,0x20);
  secp256k1_sha256_write((secp256k1_sha256 *)local_c0,msg,msglen);
  secp256k1_sha256_finalize((secp256k1_sha256 *)local_c0,(uchar *)&sha.bytes);
  secp256k1_scalar_set_b32(e,(uchar *)&sha.bytes,(int *)0x0);
  return;
}

Assistant:

static void secp256k1_schnorrsig_challenge(secp256k1_scalar* e, const unsigned char *r32, const unsigned char *msg, size_t msglen, const unsigned char *pubkey32)
{
    unsigned char buf[32];
    secp256k1_sha256 sha;

    /* tagged hash(r.x, pk.x, msg) */
    secp256k1_schnorrsig_sha256_tagged(&sha);
    secp256k1_sha256_write(&sha, r32, 32);
    secp256k1_sha256_write(&sha, pubkey32, 32);
    secp256k1_sha256_write(&sha, msg, msglen);
    secp256k1_sha256_finalize(&sha, buf);
    /* Set scalar e to the challenge hash modulo the curve order as per
     * BIP340. */
    secp256k1_scalar_set_b32(e, buf, NULL);
}